

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

Float sRGBRoundTrip(Float v,Float dither)

{
  uint8_t value;
  float in_XMM0_Da;
  uint8_t encoded;
  Float in_stack_ffffffffffffffec;
  Float in_stack_fffffffffffffff0;
  undefined4 local_4;
  
  if (0.0 <= in_XMM0_Da) {
    if (in_XMM0_Da <= 1.0) {
      value = pbrt::LinearToSRGB8(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
      local_4 = pbrt::SRGB8ToLinear(value);
    }
    else {
      local_4 = 1.0;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static Float sRGBRoundTrip(Float v, Float dither = 0) {
    if (v < 0)
        return 0;
    else if (v > 1)
        return 1;
    uint8_t encoded = LinearToSRGB8(v, dither);
    return SRGB8ToLinear(encoded);
}